

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_29b426::Trace::init_overflow_policy(Trace *this,string *polname)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
  __l;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  *local_328;
  Log local_310;
  _Self local_108;
  _Self local_100;
  const_iterator it;
  BufferPolicy local_f0 [5];
  BufferPolicy local_dc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  *local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  local_80;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
  polmap;
  string *polname_local;
  Trace *this_local;
  
  local_d8 = &local_d0;
  local_dc = Grow;
  polmap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)polname;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  ::pair<const_char_(&)[5],_(anonymous_namespace)::Trace::BufferPolicy,_true>
            (local_d8,(char (*) [5])"grow",&local_dc);
  local_d8 = &local_a8;
  local_f0[0] = Flush;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  ::pair<const_char_(&)[6],_(anonymous_namespace)::Trace::BufferPolicy,_true>
            (local_d8,(char (*) [6])0x493bd0,local_f0);
  local_d8 = &local_80;
  it._M_node._4_4_ = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
  ::pair<const_char_(&)[5],_(anonymous_namespace)::Trace::BufferPolicy,_true>
            (local_d8,(char (*) [5])"stop",(BufferPolicy *)((long)&it._M_node + 4));
  local_58 = &local_d0;
  local_50 = 3;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
             *)((long)&it._M_node + 2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
  ::allocator(this_00);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
         *)local_48,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&it._M_node + 3),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
                *)((long)&it._M_node + 2));
  local_328 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
               *)&local_58;
  do {
    local_328 = local_328 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>
    ::~pair(local_328);
  } while (local_328 != &local_d0);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
               *)local_48,(key_type *)polmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_108._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
              *)local_48);
  bVar1 = std::operator!=(&local_100,&local_108);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>
             ::operator->(&local_100);
    this->policy = ppVar2->second;
  }
  else {
    cali::Log::Log(&local_310,0);
    poVar3 = cali::Log::stream(&local_310);
    poVar3 = std::operator<<(poVar3,"trace: error: unknown buffer policy \"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    polmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_310);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Trace::BufferPolicy>_>_>
          *)local_48);
  return;
}

Assistant:

void init_overflow_policy(const std::string& polname)
    {
        const std::map<std::string, BufferPolicy> polmap { { "grow", BufferPolicy::Grow },
                                                           { "flush", BufferPolicy::Flush },
                                                           { "stop", BufferPolicy::Stop } };

        auto it = polmap.find(polname);

        if (it != polmap.end())
            policy = it->second;
        else
            Log(0).stream() << "trace: error: unknown buffer policy \"" << polname << "\"" << std::endl;
    }